

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

float gimage::anon_unknown_11::negLog(float *p)

{
  float fVar1;
  float *in_RDI;
  double dVar2;
  float ret;
  double v;
  
  dVar2 = std::log((double)(ulong)(uint)*in_RDI);
  fVar1 = *in_RDI;
  *in_RDI = -SUB84(dVar2,0);
  return fVar1 * -SUB84(dVar2,0);
}

Assistant:

inline float negLog(float &p)
{
  double v=-std::log(p);
  float ret=static_cast<float>(p*v);

  p=static_cast<float>(v);

  return ret;
}